

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Constraint *pAVar3;
  Am_Method_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Slot local_138;
  Am_Slot local_130;
  Am_Slot local_128;
  Am_Slot local_120;
  Am_Slot local_118;
  Am_Slot local_110;
  Am_Slot local_108;
  Am_Slot local_100;
  Am_Formula local_f8;
  Am_Formula local_e8;
  Am_Formula local_d8;
  Am_Formula local_c8;
  Am_Formula local_b8;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Formula local_98;
  Am_Formula local_88;
  Am_Formula local_78;
  Am_Formula local_68;
  Am_Formula local_58;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object h_scroll;
  Am_Object local_18;
  Am_Object v_scroll;
  Am_Object_Advanced obj_adv;
  
  Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&v_scroll);
  Am_Object::Am_Object(&local_18);
  Am_Object::Am_Object(&local_30);
  Am_Object::Create(&local_38,(char *)&Am_Widget_Group);
  pAVar1 = Am_Object::Add(&local_38,0x11d,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x11e,0,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x96,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x96,0);
  pAVar1 = Am_Object::Add(pAVar1,0xcc,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x17d,true,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Add(pAVar1,0x6a,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Add(pAVar1,0x6b,pAVar2,0);
  pAVar1 = Am_Object::Add(pAVar1,400,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18a,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18b,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18c,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18d,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bb,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1bc,pAVar3,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bd,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1be,pAVar3,0);
  pAVar4 = Am_Draw_Method::operator_cast_to_Am_Method_Wrapper_(&scrolling_group_draw);
  pAVar1 = Am_Object::Set(pAVar1,2000,pAVar4,0);
  pAVar4 = Am_Invalid_Method::operator_cast_to_Am_Method_Wrapper_(&scrolling_group_invalid);
  pAVar1 = Am_Object::Set(pAVar1,0x7d7,pAVar4,0);
  pAVar4 = Am_Translate_Coordinates_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_translate_coordinates);
  pAVar1 = Am_Object::Set(pAVar1,0x7dc,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_point_in_part);
  pAVar1 = Am_Object::Set(pAVar1,0x7da,pAVar4,0);
  pAVar4 = Am_Point_In_Or_Self_Method::operator_cast_to_Am_Method_Wrapper_
                     (&scroll_group_point_in_leaf);
  pAVar1 = Am_Object::Set(pAVar1,0x7db,pAVar4,0);
  pAVar4 = Am_Point_In_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_point_in_obj);
  pAVar1 = Am_Object::Set(pAVar1,0x7d9,pAVar4,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18e,400,0);
  pAVar1 = Am_Object::Add(pAVar1,399,400,0);
  pAVar1 = Am_Object::Add(pAVar1,0xc5,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Set_Old_Owner_To_Me);
  pAVar1 = Am_Object::Add(pAVar1,0x12d,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_left);
  pAVar1 = Am_Object::Add(pAVar1,0x1bf,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_top);
  pAVar1 = Am_Object::Add(pAVar1,0x1c0,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_width);
  pAVar1 = Am_Object::Add(pAVar1,0x1c1,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_height);
  pAVar1 = Am_Object::Add(pAVar1,0x1c2,pAVar3,0);
  Am_Object::Create(&local_48,(char *)&Am_Vertical_Scroll_Bar);
  pAVar5 = Am_Object::Set(&local_48,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_v_scroller_value_from_y_offset);
  pAVar5 = Am_Object::Add(pAVar5,0x8c,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_left);
  pAVar5 = Am_Object::Set(pAVar5,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_top);
  pAVar5 = Am_Object::Set(pAVar5,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_height);
  pAVar5 = Am_Object::Set(pAVar5,0x67,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_visible);
  pAVar5 = Am_Object::Set(pAVar5,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_active);
  pAVar5 = Am_Object::Set(pAVar5,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_58);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_58);
  pAVar5 = Am_Object::Set(pAVar5,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_68);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_68);
  pAVar5 = Am_Object::Set(pAVar5,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_78);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_78);
  pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar3,0);
  pAVar5 = Am_Object::Set(pAVar5,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_value_2);
  pAVar5 = Am_Object::Set(pAVar5,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar5 = Am_Object::Set(pAVar5,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_98);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_98);
  pAVar5 = Am_Object::Set(pAVar5,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_percent_visible);
  pAVar5 = Am_Object::Set(pAVar5,0x185,pAVar3,0);
  pAVar5 = Am_Object::operator=(&local_18,pAVar5);
  Am_Object::Am_Object(&local_40,pAVar5);
  pAVar1 = Am_Object::Add_Part(pAVar1,0x1c4,&local_40,0);
  Am_Object::operator=(&Am_Scrolling_Group,pAVar1);
  Am_Object::~Am_Object(&local_40);
  Am_Formula::~Am_Formula(&local_98);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_78);
  Am_Formula::~Am_Formula(&local_68);
  Am_Formula::~Am_Formula(&local_58);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Create(&local_a8,(char *)&Am_Horizontal_Scroll_Bar);
  pAVar1 = Am_Object::Set(&local_a8,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_h_scroller_value_from_x_offset);
  pAVar1 = Am_Object::Add(pAVar1,0x8b,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_left);
  pAVar1 = Am_Object::Set(pAVar1,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_top);
  pAVar1 = Am_Object::Set(pAVar1,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_width);
  pAVar1 = Am_Object::Set(pAVar1,0x66,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_active);
  pAVar1 = Am_Object::Set(pAVar1,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_b8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_b8);
  pAVar1 = Am_Object::Set(pAVar1,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_c8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_c8);
  pAVar1 = Am_Object::Set(pAVar1,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_d8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_d8);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_value_2);
  pAVar1 = Am_Object::Set(pAVar1,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_e8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_e8);
  pAVar1 = Am_Object::Set(pAVar1,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_f8);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_f8);
  pAVar1 = Am_Object::Set(pAVar1,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_percent_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x185,pAVar3,0);
  pAVar1 = Am_Object::operator=(&local_30,pAVar1);
  Am_Object::Am_Object(&local_a0,pAVar1);
  Am_Object::Add_Part(&Am_Scrolling_Group,0x1c3,&local_a0,0);
  Am_Object::~Am_Object(&local_a0);
  Am_Formula::~Am_Formula(&local_f8);
  Am_Formula::~Am_Formula(&local_e8);
  Am_Formula::~Am_Formula(&local_d8);
  Am_Formula::~Am_Formula(&local_c8);
  Am_Formula::~Am_Formula(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object_Advanced::operator=
            ((Am_Object_Advanced *)&v_scroll,(Am_Object_Advanced *)&Am_Scrolling_Group);
  local_100 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x6b);
  Am_Slot::Set_Demon_Bits(&local_100,5);
  local_108 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x11d);
  Am_Slot::Set_Demon_Bits(&local_108,5);
  local_110 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x11e);
  Am_Slot::Set_Demon_Bits(&local_110,5);
  local_118 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18a);
  Am_Slot::Set_Demon_Bits(&local_118,5);
  local_120 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18b);
  Am_Slot::Set_Demon_Bits(&local_120,5);
  local_128 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18c);
  Am_Slot::Set_Demon_Bits(&local_128,5);
  local_130 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,0x18d);
  Am_Slot::Set_Demon_Bits(&local_130,5);
  local_138 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&v_scroll,400);
  Am_Slot::Set_Demon_Bits(&local_138,5);
  Am_Object::Am_Object(&local_140,&Am_Scrolling_Group);
  remove_scrollers(&local_140);
  Am_Object::~Am_Object(&local_140);
  Am_Object::Get_Object(&local_148,(Am_Slot_Key)&local_18,0xc5);
  pAVar1 = Am_Object::Set(&local_148,0x150,"Scroll Vertical",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_do);
  pAVar1 = Am_Object::Set(pAVar1,0xca,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x147,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_selective_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x148,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_selective_repeat);
  pAVar1 = Am_Object::Set(pAVar1,0x149,pAVar4,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object(&local_148);
  Am_Object::Get_Object(&local_158,(Am_Slot_Key)&local_18,0x1ac);
  Am_Object::Get_Object(&local_150,(Am_Slot_Key)&local_158,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_v_inter_abort_do);
  Am_Object::Set(&local_150,0xc9,pAVar4,0);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_158);
  Am_Object::Get_Object(&local_160,(Am_Slot_Key)&local_30,0xc5);
  pAVar1 = Am_Object::Set(&local_160,0x150,"Scroll Horizontal",0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_do);
  pAVar1 = Am_Object::Set(pAVar1,0xca,pAVar4,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x146,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x147,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_selective_undo);
  pAVar1 = Am_Object::Set(pAVar1,0x148,pAVar4,0);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_selective_repeat);
  pAVar1 = Am_Object::Set(pAVar1,0x149,pAVar4,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object(&local_160);
  Am_Object::Get_Object(&local_170,(Am_Slot_Key)&local_30,0x1ac);
  Am_Object::Get_Object(&local_168,(Am_Slot_Key)&local_170,0xc5);
  pAVar4 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&scroll_group_h_inter_abort_do);
  Am_Object::Set(&local_168,0xc9,pAVar4,0);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_18);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&v_scroll);
  return extraout_EAX;
}

Assistant:

static void
init()
{

  Am_Choice_Internal_Command =
      Am_Command.Create(DSTR("Am_Choice_Command"))
          .Set(Am_LABEL, "Choice")
          .Set(Am_UNDO_METHOD, Am_Choice_Command_Undo)
          .Set(Am_REDO_METHOD, Am_Choice_Command_Undo) //undo works for both
          .Set(Am_SELECTIVE_UNDO_METHOD, Am_Choice_Command_Selective_Undo)
          .Set(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_Choice_Command_Repeat_Same)
          .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_Choice_Command_Repeat_New);

  Am_Choice_Interactor =
      Am_Interactor.Create(DSTR("Am_Choice_Interactor"))
          .Set(Am_INTER_START_METHOD, Am_Choice_Start_Method)
          .Set(Am_INTER_ABORT_METHOD, Am_Choice_Abort_Method)
          .Set(Am_INTER_OUTSIDE_METHOD, Am_Choice_Outside_Method)
          .Set(Am_INTER_BACK_INSIDE_METHOD, Am_Choice_Back_Inside_Method)
          .Set(Am_INTER_RUNNING_METHOD, Am_Choice_Running_Method)
          .Set(Am_INTER_STOP_METHOD, Am_Choice_Stop_Method)

          .Set(Am_START_DO_METHOD, Am_Choice_Start_Do)
          .Set(Am_INTERIM_DO_METHOD, Am_Choice_Interim_Do)
          .Set(Am_ABORT_DO_METHOD, Am_Choice_Abort_Do)
          .Set(Am_DO_METHOD, Am_Choice_Do)

          .Add(Am_FIRST_ONE_ONLY, false) // whether menu or button like
          .Set(Am_RUNNING_WHERE_TEST, same_as_start_where_test)
          .Add(Am_HOW_SET, Am_CHOICE_TOGGLE)
          .Add(Am_SET_SELECTED, true)
          .Add_Part(Am_IMPLEMENTATION_COMMAND,
                    Am_Choice_Internal_Command.Create(
                        DSTR("Choice_Internal_Command")));
  Am_Choice_Interactor.Set_Part(
      Am_COMMAND, Am_Select_Command.Create(DSTR("Am_Command_in_Choice"))
                      .Set(Am_LABEL, "Choice"));

  Am_One_Shot_Interactor =
      Am_Choice_Interactor.Create(DSTR("Am_One_Shot_Interactor"))
          .Set(Am_START_WHERE_TEST, Am_Inter_In)
          .Set(Am_CONTINUOUS, false);
  //change all the names
  Am_One_Shot_Interactor.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "One_Shot")
      .Set_Name(DSTR("Am_Command_in_One_Shot"));

  Am_One_Shot_Interactor.Get_Object(Am_IMPLEMENTATION_COMMAND)
      .Set(Am_LABEL, "One_Shot")
      .Set_Name(DSTR("One_Shot_Internal_Command"));
  Am_Choice_Interactor_Repeat_Same =
      Am_Choice_Interactor.Create(DSTR("Choice_Interactor_Repeat_Same"));
  Am_Choice_Interactor_Repeat_Same.Get_Object(Am_IMPLEMENTATION_COMMAND)
      .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD,
           Am_Choice_Command_Repeat_New_As_Same);
}